

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::anon_unknown_1::TimerManager::InternalStop(TimerManager *this)

{
  char *in_RDI;
  WallTime WVar1;
  double dVar2;
  double dVar3;
  CheckHandler *unaff_retaddr;
  uint7 in_stack_ffffffffffffffe8;
  byte bVar4;
  CheckHandler in_stack_fffffffffffffff0;
  
  bVar4 = 0;
  if ((in_RDI[0x68] & 1U) == 0) {
    internal::CheckHandler::CheckHandler
              (unaff_retaddr,in_RDI,(char *)in_stack_fffffffffffffff0.log_,
               (char *)(ulong)in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20));
    bVar4 = 1;
    internal::CheckHandler::GetLog((CheckHandler *)&stack0xfffffffffffffff0);
  }
  else {
    internal::GetNullLogInstance();
  }
  if ((bVar4 & 1) == 0) {
    in_RDI[0x68] = '\0';
    WVar1 = walltime::Now();
    *(double *)(in_RDI + 0x80) = (WVar1 - *(double *)(in_RDI + 0x70)) + *(double *)(in_RDI + 0x80);
    dVar2 = MyCPUUsage();
    dVar3 = ChildrenCPUUsage();
    *(double *)(in_RDI + 0x88) =
         ((dVar2 + dVar3) - *(double *)(in_RDI + 0x78)) + *(double *)(in_RDI + 0x88);
    return;
  }
  internal::CheckHandler::~CheckHandler((CheckHandler *)0x16943d);
}

Assistant:

REQUIRES(lock_) {
    CHECK(running_);
    running_ = false;
    real_time_used_ += walltime::Now() - start_real_time_;
    cpu_time_used_ += ((MyCPUUsage() + ChildrenCPUUsage())
                       - start_cpu_time_);
  }